

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cpp
# Opt level: O2

bool stackjit::TypeSystem::fromString(string *typeName,PrimitiveTypes *primitiveType)

{
  bool bVar1;
  PrimitiveTypes PVar2;
  
  bVar1 = std::operator==(typeName,"Int");
  PVar2 = Integer;
  if (!bVar1) {
    bVar1 = std::operator==(typeName,"Float");
    PVar2 = Float;
    if (!bVar1) {
      bVar1 = std::operator==(typeName,"Bool");
      PVar2 = Bool;
      if (!bVar1) {
        bVar1 = std::operator==(typeName,"Char");
        PVar2 = Char;
        if (!bVar1) {
          bVar1 = std::operator==(typeName,"Void");
          PVar2 = Void;
          if (!bVar1) {
            return false;
          }
        }
      }
    }
  }
  *primitiveType = PVar2;
  return true;
}

Assistant:

bool TypeSystem::fromString(std::string typeName, PrimitiveTypes& primitiveType) {
		if (typeName == "Int") {
			primitiveType = PrimitiveTypes::Integer;
			return true;
		} else if (typeName == "Float") {
			primitiveType = PrimitiveTypes::Float;
			return true;
		} else if (typeName == "Bool") {
			primitiveType = PrimitiveTypes::Bool;
			return true;
		} else if (typeName == "Char") {
			primitiveType = PrimitiveTypes::Char;
			return true;
		} else if (typeName == "Void") {
			primitiveType = PrimitiveTypes::Void;
			return true;
		}

		return false;
	}